

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_int8.h
# Opt level: O2

void ncnn::conv1x1s2_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Option *opt)

{
  int iVar1;
  void *pvVar2;
  int i;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  char *pcVar7;
  int *piVar8;
  uint c;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  Mat out0;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  Mat local_a0;
  Mat local_68;
  
  lVar13 = (long)bottom_blob->c;
  iVar1 = top_blob->w;
  iVar11 = top_blob->h;
  pvVar2 = _kernel->data;
  lVar4 = (long)(((bottom_blob->w - iVar1) - iVar1) + bottom_blob->w);
  uVar15 = 0;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  uVar12 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar12 = uVar15;
  }
  for (; uVar15 != uVar12; uVar15 = uVar15 + 1) {
    Mat::channel(&local_68,top_blob,(int)uVar15);
    Mat::fill(&local_68,0);
    lVar14 = uVar15 * lVar13;
    for (uVar9 = 0; piVar8 = (int *)local_68.data, (long)(uVar9 | 7) < lVar13; uVar9 = uVar9 + 8) {
      c = (uint)uVar9;
      Mat::channel(&local_a0,bottom_blob,c);
      local_e0 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 1);
      local_e8 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 2);
      local_f0 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 3);
      local_f8 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 4);
      local_100 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 5);
      pcVar16 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 6);
      pcVar7 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      Mat::channel(&local_a0,bottom_blob,c | 7);
      pcVar17 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      for (iVar3 = 0; iVar3 != iVar11; iVar3 = iVar3 + 1) {
        lVar6 = 0;
        piVar5 = piVar8;
        for (iVar10 = iVar1; 0 < iVar10; iVar10 = iVar10 + -1) {
          *(int *)((long)piVar8 + lVar6 * 2) =
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 6) * (int)pcVar7[lVar6] +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 5) * (int)pcVar16[lVar6] +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 4) * (int)local_100[lVar6] +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 3) * (int)local_f8[lVar6] +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 2) * (int)local_f0[lVar6] +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 1) * (int)local_e8[lVar6] +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14) * (int)local_e0[lVar6] +
               *(int *)((long)piVar8 + lVar6 * 2) +
               (int)*(char *)((long)pvVar2 + uVar9 + lVar14 + 7) * (int)pcVar17[lVar6];
          piVar5 = piVar5 + 1;
          lVar6 = lVar6 + 2;
        }
        local_e0 = local_e0 + lVar6 + lVar4;
        local_e8 = local_e8 + lVar6 + lVar4;
        local_f0 = local_f0 + lVar6 + lVar4;
        local_f8 = local_f8 + lVar6 + lVar4;
        local_100 = local_100 + lVar6 + lVar4;
        pcVar16 = pcVar16 + lVar6 + lVar4;
        pcVar7 = pcVar7 + lVar6 + lVar4;
        pcVar17 = pcVar17 + lVar6 + lVar4;
        piVar8 = piVar5;
      }
    }
    for (; piVar8 = (int *)local_68.data, (long)uVar9 < lVar13; uVar9 = uVar9 + 1) {
      Mat::channel(&local_a0,bottom_blob,(int)uVar9);
      pcVar16 = (char *)local_a0.data;
      Mat::~Mat(&local_a0);
      for (iVar3 = 0; iVar10 = iVar1, iVar3 != iVar11; iVar3 = iVar3 + 1) {
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          *piVar8 = *piVar8 + (int)*(char *)((long)pvVar2 + uVar9 + lVar14) * (int)*pcVar16;
          pcVar16 = pcVar16 + 2;
          piVar8 = piVar8 + 1;
        }
        pcVar16 = pcVar16 + lVar4;
      }
    }
    Mat::~Mat(&local_68);
  }
  return;
}

Assistant:

static void conv1x1s2_int8_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;
    const signed char *kernel = _kernel;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        out0.fill(0);

        int q = 0;

        for (; q+7<inch; q+=8)
        {
            int* outptr0 = out0;

            const signed char *kernel0 = (const signed char *)kernel + p * inch + q;

            const signed char *r0 = bottom_blob.channel(q);
            const signed char *r1 = bottom_blob.channel(q + 1);
            const signed char *r2 = bottom_blob.channel(q + 2);
            const signed char *r3 = bottom_blob.channel(q + 3);
            const signed char *r4 = bottom_blob.channel(q + 4);
            const signed char *r5 = bottom_blob.channel(q + 5);
            const signed char *r6 = bottom_blob.channel(q + 6);
            const signed char *r7 = bottom_blob.channel(q + 7);

            for(int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    //ToDo Neon
                    int sum0 = (int)*r0 * (int)kernel0[0] + (int)*r1 * (int)kernel0[1] +
                            (int)*r2 * (int)kernel0[2] + (int)*r3 * (int)kernel0[3] +
                            (int)*r4 * (int)kernel0[4] + (int)*r5 * (int)kernel0[5] +
                            (int)*r6 * (int)kernel0[6] + (int)*r7 * (int)kernel0[7];

                    *outptr0 += sum0;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    r4 += 2;
                    r5 += 2;
                    r6 += 2;
                    r7 += 2;
                    outptr0++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
                r4 += tailstep;
                r5 += tailstep;
                r6 += tailstep;
                r7 += tailstep;
            }
        }

        for (; q<inch; q++)
        {
            int* outptr0 = out0;

            const signed char *r0 = bottom_blob.channel(q);

            const signed char *kernel0 = (const signed char *)kernel + p * inch + q;

            for(int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    //ToDo Neon
                    int sum0 = (int)*r0 * (int)kernel0[0];

                    *outptr0 += sum0;

                    r0 += 2;
                    outptr0++;
                }

                r0 += tailstep;
            }
        }
    }
}